

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamping.c
# Opt level: O2

void push_complete_tx_timestamp(pending_tx_timestamps *tx_timestamps,timespec *to_add)

{
  timestamp_info *ptVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  timestamp_info *ptVar5;
  ulong uVar6;
  __syscall_slong_t _Var7;
  uint uVar8;
  
  ptVar5 = tx_timestamps->pending;
  uVar4 = tx_timestamps->tail;
  uVar8 = get_max_pending_reqs();
  uVar6 = (ulong)uVar4 % (ulong)uVar8;
  _Var7 = to_add->tv_nsec;
  ptVar1 = ptVar5 + uVar6;
  (ptVar1->time).tv_sec = to_add->tv_sec;
  (ptVar1->time).tv_nsec = _Var7;
  uVar2 = tx_timestamps->head;
  uVar3 = tx_timestamps->tail;
  tx_timestamps->head = uVar2 + 1;
  tx_timestamps->tail = uVar3 + 1;
  add_tx_timestamp(&ptVar5[uVar6].time);
  return;
}

Assistant:

void push_complete_tx_timestamp(struct pending_tx_timestamps *tx_timestamps,
								struct timespec *to_add)
{
	struct timestamp_info *ts_info;

	ts_info =
		&tx_timestamps->pending[tx_timestamps->tail % get_max_pending_reqs()];
	ts_info->time = *to_add;
	// this is confusing but the consumed is used when receiving the reply
	tx_timestamps->head++;
	tx_timestamps->tail++;
	add_tx_timestamp(&ts_info->time);
}